

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QSslCertificate> * __thiscall
QList<QSslCertificate>::operator+=(QList<QSslCertificate> *this,QList<QSslCertificate> *l)

{
  qsizetype *pqVar1;
  long lVar2;
  Data *pDVar3;
  QSslCertificate *pQVar4;
  QSslCertificate *pQVar5;
  QSslCertificatePrivate *pQVar6;
  QSslCertificate *pQVar7;
  
  lVar2 = (l->d).size;
  if (lVar2 != 0) {
    pDVar3 = (l->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pQVar4 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
                ((QCommonArrayOps<QSslCertificate> *)this,pQVar4,pQVar4 + lVar2);
    }
    else {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                (&this->d,GrowsAtEnd,lVar2,(QSslCertificate **)0x0,
                 (QArrayDataPointer<QSslCertificate> *)0x0);
      lVar2 = (l->d).size;
      if ((lVar2 != 0) && (0 < lVar2)) {
        pQVar7 = (l->d).ptr;
        pQVar4 = pQVar7 + lVar2;
        pQVar5 = (this->d).ptr;
        do {
          lVar2 = (this->d).size;
          pQVar6 = (pQVar7->d).d.ptr;
          (pQVar7->d).d.ptr = (QSslCertificatePrivate *)0x0;
          pQVar5[lVar2].d.d.ptr = pQVar6;
          pQVar7 = pQVar7 + 1;
          pqVar1 = &(this->d).size;
          *pqVar1 = *pqVar1 + 1;
        } while (pQVar7 < pQVar4);
      }
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }